

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

interval_t __thiscall
duckdb::Interpolator<true>::
Operation<duckdb::interval_t,duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
          (Interpolator<true> *this,interval_t *v_t,Vector *result,
          QuantileDirect<duckdb::interval_t> *accessor)

{
  RESULT_TYPE RVar1;
  interval_t iVar2;
  
  RVar1 = InterpolateInternal<duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
                    (this,v_t,accessor);
  iVar2.micros = RVar1.micros;
  iVar2.months = (int)iVar2.micros;
  iVar2.days = (int)((ulong)iVar2.micros >> 0x20);
  iVar2 = Cast::Operation<duckdb::interval_t,duckdb::interval_t>(RVar1._0_8_,iVar2);
  return iVar2;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}